

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O1

void asio::detail::
     wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30),_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  _func_void_any_executor_base_ptr_function_ptr *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int32_t iVar4;
  long *plVar5;
  undefined8 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  function_view fVar7;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor,_void>
  w;
  ptr p;
  allocator<void> local_d1;
  function local_d0;
  type local_c8;
  scheduler_operation *local_b0;
  undefined8 uStack_a8;
  any_executor_base local_a0;
  scheduler_operation *local_70;
  int local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ptr local_58;
  ptr local_40;
  
  local_58.h = (type *)(base + 2);
  local_58.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
                *)base;
  local_58.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
                *)base;
  execution::detail::any_executor_base::any_executor_base(&local_a0,(any_executor_base *)(base + 3))
  ;
  local_70 = base[5].next_;
  base[5].next_ =
       (scheduler_operation *)
       execution::
       any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
       ::prop_fns_table<void>()::fns;
  local_58.h = &local_c8;
  local_c8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)base[2].next_;
  local_c8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[2].func_;
  base[2].func_ = (func_type)0x0;
  base[2].next_ = (scheduler_operation *)0x0;
  local_c8.timerIndex = base[2].task_result_;
  local_b0 = base[1].next_;
  uStack_a8 = (error_category *)base[1].func_;
  ptr::reset(&local_58);
  iVar4 = local_c8.timerIndex;
  _Var3._M_pi = local_c8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar2 = local_c8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (owner != (void *)0x0) {
    if (local_a0.target_ == (void *)0x0) {
      helics::processTimerCallback(&local_c8.ptr,local_c8.timerIndex,(error_code *)&local_b0);
    }
    else if ((local_a0.target_fns_)->blocking_execute ==
             (_func_void_any_executor_base_ptr_function_view *)0x0) {
      p_Var1 = (local_a0.target_fns_)->execute;
      local_c8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_c8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_68 = (int)local_b0;
      uStack_64 = local_b0._4_4_;
      uStack_60 = (undefined4)uStack_a8;
      uStack_5c = uStack_a8._4_4_;
      local_40.a = &local_d1;
      plVar5 = (long *)__tls_get_addr(&PTR_0057ce40);
      if (*plVar5 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(undefined8 *)(*plVar5 + 8);
      }
      local_d0.impl_ =
           (impl_base *)
           thread_info_base::allocate<asio::detail::thread_info_base::executor_function_tag>
                     (uVar6,0x38,8);
      local_40.p = (impl<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_std::error_code>,_std::allocator<void>_>
                    *)0x0;
      local_d0.impl_[1].complete_ = (_func_void_impl_base_ptr_bool *)peVar2;
      local_d0.impl_[2].complete_ = (_func_void_impl_base_ptr_bool *)_Var3._M_pi;
      *(int32_t *)&local_d0.impl_[3].complete_ = iVar4;
      local_d0.impl_[4].complete_ = (_func_void_impl_base_ptr_bool *)CONCAT44(uStack_64,local_68);
      local_d0.impl_[5].complete_ = (_func_void_impl_base_ptr_bool *)CONCAT44(uStack_5c,uStack_60);
      (local_d0.impl_)->complete_ =
           executor_function::
           complete<asio::detail::binder1<helics::MessageTimer::updateTimer(int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)::__0,std::error_code>,std::allocator<void>>
      ;
      local_40.v = (void *)0x0;
      executor_function::
      impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30),_std::error_code>,_std::allocator<void>_>
      ::ptr::reset(&local_40);
      (*p_Var1)(&local_a0,&local_d0);
      if (local_d0.impl_ != (impl_base *)0x0) {
        (*(local_d0.impl_)->complete_)(local_d0.impl_,false);
      }
    }
    else {
      fVar7.function_ = &local_c8;
      fVar7.complete_ =
           executor_function_view::
           complete<asio::detail::binder1<helics::MessageTimer::updateTimer(int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)::__0,std::error_code>>
      ;
      (*(local_a0.target_fns_)->blocking_execute)(&local_a0,fVar7);
    }
  }
  if (local_c8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a0.target_ != (void *)0x0) {
    (*(local_a0.object_fns_)->destroy)(&local_a0);
  }
  ptr::reset(&local_58);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    wait_handler* h(static_cast<wait_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        static_cast<handler_work<Handler, IoExecutor>&&>(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(h->handler_, h->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }